

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void decompressBlockDifferentialWithAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alpha,int width,int height,
               int startx,int starty,int channelsRGB)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  uint in_EDI;
  int in_R8D;
  int x_1;
  int mod;
  int y;
  int x;
  uint pixel_indices_LSB;
  uint pixel_indices_MSB;
  int channelsA;
  int flipbit;
  int diffbit;
  int b;
  int g;
  int r;
  int shift;
  int index;
  int table;
  char diff [3];
  uint8 enc_color2 [3];
  uint8 enc_color1 [3];
  uint8 avg_color [3];
  char local_e8;
  char local_e4;
  char local_e0;
  char local_dc;
  char local_d8;
  char local_d4;
  char local_d0;
  char local_cc;
  char local_c8;
  char local_c4;
  char local_c0;
  char local_bc;
  char local_b8;
  char local_b4;
  char local_b0;
  char local_ac;
  char local_a8;
  char local_a4;
  char local_a0;
  char local_9c;
  char local_98;
  char local_94;
  char local_90;
  char local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  uint local_78;
  int local_74;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  uint local_60;
  int local_5c;
  int local_50;
  int mod_3;
  int y_3;
  int x_3;
  int mod_2;
  int y_2;
  int x_2;
  int mod_1;
  int y_1;
  
  if (channelsA == 3) {
    local_50 = 1;
    _x_3 = in_RCX;
  }
  else {
    local_50 = 4;
    _x_3 = in_RDX + 3;
  }
  uVar12 = in_EDI >> 1 & 1;
  bVar11 = (byte)(in_EDI >> 0x18);
  bVar10 = bVar11 >> 3;
  bVar4 = (byte)(in_EDI >> 0x13) & 0x1f;
  bVar5 = (byte)(in_EDI >> 0xb) & 0x1f;
  bVar6 = bVar10 << 3 | (byte)((int)(uint)bVar10 >> 2);
  bVar7 = bVar4 << 3 | (byte)((int)(uint)bVar4 >> 2);
  bVar8 = bVar5 << 3 | (byte)((int)(uint)bVar5 >> 2);
  iVar13 = (in_EDI >> 5 & 7) << 1;
  if ((in_EDI & 1) == 0) {
    bVar9 = 0;
    for (local_5c = y; local_5c < y + 2; local_5c = local_5c + 1) {
      for (local_60 = pixel_indices_LSB; (int)local_60 < (int)(pixel_indices_LSB + 4);
          local_60 = local_60 + 1) {
        bVar2 = bVar9 & 0x1f;
        bVar3 = bVar9 & 0x1f;
        bVar9 = bVar9 + 1;
        iVar1 = unscramble
                [(int)((in_ESI & 0xffff) >> bVar3 & 1 | ((in_ESI >> 0x10) >> bVar2 & 1) << 1)];
        local_64 = compressParams[iVar13][iVar1];
        if ((uVar12 == 0) && ((iVar1 == 1 || (iVar1 == 2)))) {
          local_64 = 0;
        }
        local_a0 = (char)local_64;
        if ((int)((uint)bVar6 + local_64) < 0) {
          local_8c = '\0';
        }
        else {
          if ((int)((uint)bVar6 + local_64) < 0x100) {
            local_90 = bVar6 + local_a0;
          }
          else {
            local_90 = -1;
          }
          local_8c = local_90;
        }
        *(char *)(in_RDX + (int)(channelsA * (local_60 * in_R8D + local_5c))) = local_8c;
        if ((int)((uint)bVar7 + local_64) < 0) {
          local_94 = '\0';
        }
        else {
          if ((int)((uint)bVar7 + local_64) < 0x100) {
            local_98 = bVar7 + local_a0;
          }
          else {
            local_98 = -1;
          }
          local_94 = local_98;
        }
        *(char *)(in_RDX + (int)(channelsA * (local_60 * in_R8D + local_5c) + 1)) = local_94;
        if ((int)((uint)bVar8 + local_64) < 0) {
          local_9c = '\0';
        }
        else {
          if ((int)((uint)bVar8 + local_64) < 0x100) {
            local_a0 = bVar8 + local_a0;
          }
          else {
            local_a0 = -1;
          }
          local_9c = local_a0;
        }
        *(char *)(in_RDX + (int)(channelsA * (local_60 * in_R8D + local_5c) + 2)) = local_9c;
        if ((uVar12 == 0) && (iVar1 == 1)) {
          *(undefined1 *)(_x_3 + (int)((local_60 * in_R8D + local_5c) * local_50)) = 0;
          *(undefined1 *)(in_RDX + (int)(channelsA * (local_60 * in_R8D + local_5c))) = 0;
          *(undefined1 *)(in_RDX + (int)(channelsA * (local_60 * in_R8D + local_5c) + 1)) = 0;
          *(undefined1 *)(in_RDX + (int)(channelsA * (local_60 * in_R8D + local_5c) + 2)) = 0;
        }
        else {
          *(undefined1 *)(_x_3 + (int)((local_60 * in_R8D + local_5c) * local_50)) = 0xff;
        }
      }
    }
  }
  else {
    bVar9 = 0;
    for (local_68 = y; local_68 < y + 4; local_68 = local_68 + 1) {
      for (local_6c = pixel_indices_LSB; (int)local_6c < (int)(pixel_indices_LSB + 2);
          local_6c = local_6c + 1) {
        bVar2 = bVar9 & 0x1f;
        bVar3 = bVar9 & 0x1f;
        bVar9 = bVar9 + 1;
        iVar1 = unscramble
                [(int)((in_ESI & 0xffff) >> bVar3 & 1 | ((in_ESI >> 0x10) >> bVar2 & 1) << 1)];
        local_70 = compressParams[iVar13][iVar1];
        if ((uVar12 == 0) && ((iVar1 == 1 || (iVar1 == 2)))) {
          local_70 = 0;
        }
        local_b8 = (char)local_70;
        if ((int)((uint)bVar6 + local_70) < 0) {
          local_a4 = '\0';
        }
        else {
          if ((int)((uint)bVar6 + local_70) < 0x100) {
            local_a8 = bVar6 + local_b8;
          }
          else {
            local_a8 = -1;
          }
          local_a4 = local_a8;
        }
        *(char *)(in_RDX + (int)(channelsA * (local_6c * in_R8D + local_68))) = local_a4;
        if ((int)((uint)bVar7 + local_70) < 0) {
          local_ac = '\0';
        }
        else {
          if ((int)((uint)bVar7 + local_70) < 0x100) {
            local_b0 = bVar7 + local_b8;
          }
          else {
            local_b0 = -1;
          }
          local_ac = local_b0;
        }
        *(char *)(in_RDX + (int)(channelsA * (local_6c * in_R8D + local_68) + 1)) = local_ac;
        if ((int)((uint)bVar8 + local_70) < 0) {
          local_b4 = '\0';
        }
        else {
          if ((int)((uint)bVar8 + local_70) < 0x100) {
            local_b8 = bVar8 + local_b8;
          }
          else {
            local_b8 = -1;
          }
          local_b4 = local_b8;
        }
        *(char *)(in_RDX + (int)(channelsA * (local_6c * in_R8D + local_68) + 2)) = local_b4;
        if ((uVar12 == 0) && (iVar1 == 1)) {
          *(undefined1 *)(_x_3 + (int)((local_6c * in_R8D + local_68) * local_50)) = 0;
          *(undefined1 *)(in_RDX + (int)(channelsA * (local_6c * in_R8D + local_68))) = 0;
          *(undefined1 *)(in_RDX + (int)(channelsA * (local_6c * in_R8D + local_68) + 1)) = 0;
          *(undefined1 *)(in_RDX + (int)(channelsA * (local_6c * in_R8D + local_68) + 2)) = 0;
        }
        else {
          *(undefined1 *)(_x_3 + (int)((local_6c * in_R8D + local_68) * local_50)) = 0xff;
        }
      }
      bVar9 = bVar9 + 2;
    }
  }
  bVar10 = bVar10 + ((char)(bVar11 << 5) >> 5);
  bVar4 = bVar4 + ((char)((char)(in_EDI >> 0x10) << 5) >> 5);
  bVar5 = bVar5 + ((char)((char)(in_EDI >> 8) << 5) >> 5);
  bVar10 = bVar10 * '\b' | (byte)((int)(uint)bVar10 >> 2);
  bVar11 = bVar4 * '\b' | (byte)((int)(uint)bVar4 >> 2);
  bVar6 = bVar5 * '\b' | (byte)((int)(uint)bVar5 >> 2);
  iVar13 = (in_EDI >> 2 & 7) << 1;
  if ((in_EDI & 1) == 0) {
    bVar7 = 8;
    for (local_74 = y + 2; local_74 < y + 4; local_74 = local_74 + 1) {
      for (local_78 = pixel_indices_LSB; (int)local_78 < (int)(pixel_indices_LSB + 4);
          local_78 = local_78 + 1) {
        bVar8 = bVar7 & 0x1f;
        bVar4 = bVar7 & 0x1f;
        bVar7 = bVar7 + 1;
        iVar1 = unscramble
                [(int)((in_ESI & 0xffff) >> bVar4 & 1 | ((in_ESI >> 0x10) >> bVar8 & 1) << 1)];
        local_7c = compressParams[iVar13][iVar1];
        if ((uVar12 == 0) && ((iVar1 == 1 || (iVar1 == 2)))) {
          local_7c = 0;
        }
        local_d0 = (char)local_7c;
        if ((int)((uint)bVar10 + local_7c) < 0) {
          local_bc = '\0';
        }
        else {
          if ((int)((uint)bVar10 + local_7c) < 0x100) {
            local_c0 = bVar10 + local_d0;
          }
          else {
            local_c0 = -1;
          }
          local_bc = local_c0;
        }
        *(char *)(in_RDX + (int)(channelsA * (local_78 * in_R8D + local_74))) = local_bc;
        if ((int)((uint)bVar11 + local_7c) < 0) {
          local_c4 = '\0';
        }
        else {
          if ((int)((uint)bVar11 + local_7c) < 0x100) {
            local_c8 = bVar11 + local_d0;
          }
          else {
            local_c8 = -1;
          }
          local_c4 = local_c8;
        }
        *(char *)(in_RDX + (int)(channelsA * (local_78 * in_R8D + local_74) + 1)) = local_c4;
        if ((int)((uint)bVar6 + local_7c) < 0) {
          local_cc = '\0';
        }
        else {
          if ((int)((uint)bVar6 + local_7c) < 0x100) {
            local_d0 = bVar6 + local_d0;
          }
          else {
            local_d0 = -1;
          }
          local_cc = local_d0;
        }
        *(char *)(in_RDX + (int)(channelsA * (local_78 * in_R8D + local_74) + 2)) = local_cc;
        if ((uVar12 == 0) && (iVar1 == 1)) {
          *(undefined1 *)(_x_3 + (int)((local_78 * in_R8D + local_74) * local_50)) = 0;
          *(undefined1 *)(in_RDX + (int)(channelsA * (local_78 * in_R8D + local_74))) = 0;
          *(undefined1 *)(in_RDX + (int)(channelsA * (local_78 * in_R8D + local_74) + 1)) = 0;
          *(undefined1 *)(in_RDX + (int)(channelsA * (local_78 * in_R8D + local_74) + 2)) = 0;
        }
        else {
          *(undefined1 *)(_x_3 + (int)((local_78 * in_R8D + local_74) * local_50)) = 0xff;
        }
      }
    }
  }
  else {
    bVar7 = 2;
    for (local_80 = y; local_80 < y + 4; local_80 = local_80 + 1) {
      for (local_84 = pixel_indices_LSB + 2; local_84 < (int)(pixel_indices_LSB + 4);
          local_84 = local_84 + 1) {
        bVar8 = bVar7 & 0x1f;
        bVar4 = bVar7 & 0x1f;
        bVar7 = bVar7 + 1;
        iVar1 = unscramble
                [(int)((in_ESI & 0xffff) >> bVar4 & 1 | ((in_ESI >> 0x10) >> bVar8 & 1) << 1)];
        local_88 = compressParams[iVar13][iVar1];
        if ((uVar12 == 0) && ((iVar1 == 1 || (iVar1 == 2)))) {
          local_88 = 0;
        }
        local_e8 = (char)local_88;
        if ((int)((uint)bVar10 + local_88) < 0) {
          local_d4 = '\0';
        }
        else {
          if ((int)((uint)bVar10 + local_88) < 0x100) {
            local_d8 = bVar10 + local_e8;
          }
          else {
            local_d8 = -1;
          }
          local_d4 = local_d8;
        }
        *(char *)(in_RDX + channelsA * (local_84 * in_R8D + local_80)) = local_d4;
        if ((int)((uint)bVar11 + local_88) < 0) {
          local_dc = '\0';
        }
        else {
          if ((int)((uint)bVar11 + local_88) < 0x100) {
            local_e0 = bVar11 + local_e8;
          }
          else {
            local_e0 = -1;
          }
          local_dc = local_e0;
        }
        *(char *)(in_RDX + (channelsA * (local_84 * in_R8D + local_80) + 1)) = local_dc;
        if ((int)((uint)bVar6 + local_88) < 0) {
          local_e4 = '\0';
        }
        else {
          if ((int)((uint)bVar6 + local_88) < 0x100) {
            local_e8 = bVar6 + local_e8;
          }
          else {
            local_e8 = -1;
          }
          local_e4 = local_e8;
        }
        *(char *)(in_RDX + (channelsA * (local_84 * in_R8D + local_80) + 2)) = local_e4;
        if ((uVar12 == 0) && (iVar1 == 1)) {
          *(undefined1 *)(_x_3 + (local_84 * in_R8D + local_80) * local_50) = 0;
          *(undefined1 *)(in_RDX + channelsA * (local_84 * in_R8D + local_80)) = 0;
          *(undefined1 *)(in_RDX + (channelsA * (local_84 * in_R8D + local_80) + 1)) = 0;
          *(undefined1 *)(in_RDX + (channelsA * (local_84 * in_R8D + local_80) + 2)) = 0;
        }
        else {
          *(undefined1 *)(_x_3 + (local_84 * in_R8D + local_80) * local_50) = 0xff;
        }
      }
      bVar7 = bVar7 + 2;
    }
  }
  return;
}

Assistant:

void decompressBlockDifferentialWithAlphaC(unsigned int block_part1, unsigned int block_part2, uint8* img, uint8* alpha, int width, int height, int startx, int starty, int channelsRGB)
{
	
	uint8 avg_color[3], enc_color1[3], enc_color2[3];
	signed char diff[3];
	int table;
	int index,shift;
	int r,g,b;
	int diffbit;
	int flipbit;
  int channelsA;

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alpha = &img[0+3];
  }

	//the diffbit now encodes whether or not the entire alpha channel is 255.
	diffbit = (GETBITSHIGH(block_part1, 1, 33));
 	flipbit = (GETBITSHIGH(block_part1, 1, 32));

	// First decode left part of block.
	enc_color1[0]= GETBITSHIGH(block_part1, 5, 63);
	enc_color1[1]= GETBITSHIGH(block_part1, 5, 55);
	enc_color1[2]= GETBITSHIGH(block_part1, 5, 47);

	// Expand from 5 to 8 bits
	avg_color[0] = (enc_color1[0] <<3) | (enc_color1[0] >> 2);
	avg_color[1] = (enc_color1[1] <<3) | (enc_color1[1] >> 2);
	avg_color[2] = (enc_color1[2] <<3) | (enc_color1[2] >> 2);

	table = GETBITSHIGH(block_part1, 3, 39) << 1;

	unsigned int pixel_indices_MSB, pixel_indices_LSB;
		
	pixel_indices_MSB = GETBITS(block_part2, 16, 31);
	pixel_indices_LSB = GETBITS(block_part2, 16, 15);

	if( (flipbit) == 0 )
	{
		// We should not flip
		shift = 0;
		for(int x=startx; x<startx+2; x++)
		{
			for(int y=starty; y<starty+4; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];

				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}

			}
		}
	}
	else
	{
		// We should flip
		shift = 0;
		for(int x=startx; x<startx+4; x++)
		{
			for(int y=starty; y<starty+2; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];
				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}
			}
			shift+=2;
		}
	}
	// Now decode right part of block. 
	diff[0]= GETBITSHIGH(block_part1, 3, 58);
	diff[1]= GETBITSHIGH(block_part1, 3, 50);
	diff[2]= GETBITSHIGH(block_part1, 3, 42);

	// Extend sign bit to entire byte. 
	diff[0] = (diff[0] << 5);
	diff[1] = (diff[1] << 5);
	diff[2] = (diff[2] << 5);
	diff[0] = diff[0] >> 5;
	diff[1] = diff[1] >> 5;
	diff[2] = diff[2] >> 5;

	//  Calculate second color
	enc_color2[0]= enc_color1[0] + diff[0];
	enc_color2[1]= enc_color1[1] + diff[1];
	enc_color2[2]= enc_color1[2] + diff[2];

	// Expand from 5 to 8 bits
	avg_color[0] = (enc_color2[0] <<3) | (enc_color2[0] >> 2);
	avg_color[1] = (enc_color2[1] <<3) | (enc_color2[1] >> 2);
	avg_color[2] = (enc_color2[2] <<3) | (enc_color2[2] >> 2);

	table = GETBITSHIGH(block_part1, 3, 36) << 1;
	pixel_indices_MSB = GETBITS(block_part2, 16, 31);
	pixel_indices_LSB = GETBITS(block_part2, 16, 15);

	if( (flipbit) == 0 )
	{
		// We should not flip
		shift=8;
		for(int x=startx+2; x<startx+4; x++)
		{
			for(int y=starty; y<starty+4; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];
				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}
			}
		}
	}
	else
	{
		// We should flip
		shift=2;
		for(int x=startx; x<startx+4; x++)
		{
			for(int y=starty+2; y<starty+4; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];
				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}
			}
			shift += 2;
		}
	}
}